

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawLineEx(Vector2 startPos,Vector2 endPos,float thick,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector2 strip [4];
  Vector2 local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  fVar4 = endPos.x;
  fVar5 = endPos.y;
  fVar1 = startPos.x;
  fVar3 = startPos.y;
  fVar6 = fVar4 - fVar1;
  fVar7 = fVar5 - fVar3;
  fVar2 = fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  if ((0.0 < thick) && (0.0 < fVar2)) {
    fVar2 = thick / (fVar2 + fVar2);
    fVar6 = fVar6 * fVar2;
    fVar7 = fVar7 * -fVar2;
    local_28.x = fVar1 - fVar7;
    local_28.y = fVar3 - fVar6;
    local_20 = fVar1 + fVar7;
    local_1c = fVar3 + fVar6;
    local_18 = fVar4 - fVar7;
    local_14 = fVar5 - fVar6;
    local_10 = fVar7 + fVar4;
    local_c = fVar6 + fVar5;
    DrawTriangleStrip(&local_28,4,color);
  }
  return;
}

Assistant:

void DrawLineEx(Vector2 startPos, Vector2 endPos, float thick, Color color)
{
    Vector2 delta = {endPos.x-startPos.x, endPos.y-startPos.y};
    float   length = sqrtf(delta.x*delta.x + delta.y*delta.y);

    if (length > 0  &&  thick > 0)
    {
        float   scale = thick/(2*length);
        Vector2 radius = {-scale*delta.y, scale*delta.x};
        Vector2 strip[] = {{startPos.x-radius.x, startPos.y-radius.y}, {startPos.x+radius.x, startPos.y+radius.y},
                           {endPos.x-radius.x, endPos.y-radius.y}, {endPos.x+radius.x, endPos.y+radius.y}};

        DrawTriangleStrip(strip, 4, color);
    }
}